

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<3UL>::SetProperty
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance,JavascriptString *propertyNameString
          ,Var value,PropertyOperationFlags flags,PropertyValueInfo *info)

{
  BOOL BVar1;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  propertyRecord = (PropertyRecord *)info;
  ScriptContext::GetOrAddPropertyRecord
            ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_40);
  BVar1 = SetProperty(this,instance,local_40->pid,value,flags,(PropertyValueInfo *)propertyRecord);
  return BVar1;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetProperty(DynamicObject* instance, JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        // Either the property exists in the dictionary, in which case a PropertyRecord for it exists,
        // or we have to add it to the dictionary, in which case we need to get or create a PropertyRecord.
        // Thus, just get or create one and call the PropertyId overload of SetProperty.
        PropertyRecord const* propertyRecord;
        instance->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return SimpleTypeHandler<size>::SetProperty(instance, propertyRecord->GetPropertyId(), value, flags, info);
    }